

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_callback(ompt_callbacks_t which,ompt_callback_t *callback)

{
  undefined8 *in_RSI;
  undefined4 in_EDI;
  ompt_callback_t mycb_16;
  ompt_callback_t mycb_15;
  ompt_callback_t mycb_14;
  ompt_callback_t mycb_13;
  ompt_callback_t mycb_12;
  ompt_callback_t mycb_11;
  ompt_callback_t mycb_10;
  ompt_callback_t mycb_9;
  ompt_callback_t mycb_8;
  ompt_callback_t mycb_7;
  ompt_callback_t mycb_6;
  ompt_callback_t mycb_5;
  ompt_callback_t mycb_4;
  ompt_callback_t mycb_3;
  ompt_callback_t mycb_2;
  ompt_callback_t mycb_1;
  ompt_callback_t mycb;
  ompt_callback_t mycb_31;
  ompt_callback_t mycb_30;
  ompt_callback_t mycb_29;
  ompt_callback_t mycb_28;
  ompt_callback_t mycb_27;
  ompt_callback_t mycb_26;
  ompt_callback_t mycb_25;
  ompt_callback_t mycb_24;
  ompt_callback_t mycb_23;
  ompt_callback_t mycb_22;
  ompt_callback_t mycb_21;
  ompt_callback_t mycb_20;
  ompt_callback_t mycb_19;
  ompt_callback_t mycb_18;
  ompt_callback_t mycb_17;
  
  if (((ulong)ompt_enabled & 1) == 0) {
    mycb_17._4_4_ = 0;
  }
  else {
    switch(in_EDI) {
    case 1:
      if ((((ulong)ompt_enabled >> 1 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_thread_begin_callback == (ompt_callback_thread_begin_t)0x0))
      {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_thread_begin_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 2:
      if ((((ulong)ompt_enabled >> 2 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_thread_end_callback == (ompt_callback_thread_end_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_thread_end_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 3:
      if ((((ulong)ompt_enabled >> 3 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_parallel_begin_callback ==
          (ompt_callback_parallel_begin_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_parallel_begin_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 4:
      if ((((ulong)ompt_enabled >> 4 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_parallel_end_callback == (ompt_callback_parallel_end_t)0x0))
      {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_parallel_end_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 5:
      if ((((ulong)ompt_enabled >> 5 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_task_create_callback == (ompt_callback_task_create_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_task_create_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 6:
      if ((((ulong)ompt_enabled >> 6 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_task_schedule_callback == (ompt_callback_task_schedule_t)0x0)
         ) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_task_schedule_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 7:
      if ((((ulong)ompt_enabled >> 7 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_implicit_task_callback == (ompt_callback_implicit_task_t)0x0)
         ) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_implicit_task_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 8:
      if ((((ulong)ompt_enabled >> 8 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_target_callback == (ompt_callback_target_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_target_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 9:
      if ((((ulong)ompt_enabled >> 9 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_target_data_op_callback ==
          (ompt_callback_target_data_op_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_target_data_op_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 10:
      if ((((ulong)ompt_enabled >> 10 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_target_submit_callback == (ompt_callback_target_submit_t)0x0)
         ) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_target_submit_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0xb:
      if ((((ulong)ompt_enabled >> 0xb & 1) == 0) ||
         (ompt_callbacks.ompt_callback_control_tool_callback == (ompt_callback_control_tool_t)0x0))
      {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_control_tool_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0xc:
      if ((((ulong)ompt_enabled >> 0xc & 1) == 0) ||
         (ompt_callbacks.ompt_callback_device_initialize_callback ==
          (ompt_callback_device_initialize_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_device_initialize_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0xd:
      if ((((ulong)ompt_enabled >> 0xd & 1) == 0) ||
         (ompt_callbacks.ompt_callback_device_finalize_callback ==
          (ompt_callback_device_finalize_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_device_finalize_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0xe:
      if ((((ulong)ompt_enabled >> 0xe & 1) == 0) ||
         (ompt_callbacks.ompt_callback_device_load_callback == (ompt_callback_device_load_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_device_load_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0xf:
      if ((((ulong)ompt_enabled >> 0xf & 1) == 0) ||
         (ompt_callbacks.ompt_callback_device_unload_callback == (ompt_callback_device_unload_t)0x0)
         ) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_device_unload_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x10:
      if ((((ulong)ompt_enabled >> 0x10 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_sync_region_wait_callback == (ompt_callback_sync_region_t)0x0
         )) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_sync_region_wait_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x11:
      if ((((ulong)ompt_enabled >> 0x11 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_mutex_released_callback == (ompt_callback_mutex_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_mutex_released_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x12:
      if ((((ulong)ompt_enabled >> 0x12 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_dependences_callback == (ompt_callback_dependences_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_dependences_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x13:
      if ((((ulong)ompt_enabled >> 0x13 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_task_dependence_callback ==
          (ompt_callback_task_dependence_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_task_dependence_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x14:
      if ((((ulong)ompt_enabled >> 0x14 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_work_callback == (ompt_callback_work_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_work_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x15:
      if ((((ulong)ompt_enabled >> 0x15 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_master_callback == (ompt_callback_master_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_master_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x16:
      if ((((ulong)ompt_enabled >> 0x16 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_target_map_callback == (ompt_callback_target_map_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_target_map_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x17:
      if ((((ulong)ompt_enabled >> 0x17 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_sync_region_callback == (ompt_callback_sync_region_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_sync_region_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x18:
      if ((((ulong)ompt_enabled >> 0x18 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_lock_init_callback == (ompt_callback_mutex_acquire_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_lock_init_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x19:
      if ((((ulong)ompt_enabled >> 0x19 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_lock_destroy_callback == (ompt_callback_mutex_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_lock_destroy_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1a:
      if ((((ulong)ompt_enabled >> 0x1a & 1) == 0) ||
         (ompt_callbacks.ompt_callback_mutex_acquire_callback == (ompt_callback_mutex_acquire_t)0x0)
         ) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_mutex_acquire_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1b:
      if ((((ulong)ompt_enabled >> 0x1b & 1) == 0) ||
         (ompt_callbacks.ompt_callback_mutex_acquired_callback == (ompt_callback_mutex_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_mutex_acquired_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1c:
      if ((((ulong)ompt_enabled >> 0x1c & 1) == 0) ||
         (ompt_callbacks.ompt_callback_nest_lock_callback == (ompt_callback_nest_lock_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_nest_lock_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1d:
      if ((((ulong)ompt_enabled >> 0x1d & 1) == 0) ||
         (ompt_callbacks.ompt_callback_flush_callback == (ompt_callback_flush_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_flush_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1e:
      if ((((ulong)ompt_enabled >> 0x1e & 1) == 0) ||
         (ompt_callbacks.ompt_callback_cancel_callback == (ompt_callback_cancel_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_cancel_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x1f:
      if ((((ulong)ompt_enabled >> 0x1f & 1) == 0) ||
         (ompt_callbacks.ompt_callback_reduction_callback == (ompt_callback_sync_region_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_reduction_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    case 0x20:
      if ((((ulong)ompt_enabled >> 0x20 & 1) == 0) ||
         (ompt_callbacks.ompt_callback_dispatch_callback == (ompt_callback_dispatch_t)0x0)) {
        mycb_17._4_4_ = 0;
      }
      else {
        *in_RSI = ompt_callbacks.ompt_callback_dispatch_callback;
        mycb_17._4_4_ = 1;
      }
      break;
    default:
      mycb_17._4_4_ = 0;
    }
  }
  return mycb_17._4_4_;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_callback(ompt_callbacks_t which,
                                       ompt_callback_t *callback) {
  if (!ompt_enabled.enabled)
    return ompt_get_callback_failure;

  switch (which) {

#define ompt_event_macro(event_name, callback_type, event_id)                  \
  case event_name:                                                             \
    if (ompt_event_implementation_status(event_name)) {                        \
      ompt_callback_t mycb =                                                   \
          (ompt_callback_t)ompt_callbacks.ompt_callback(event_name);           \
      if (ompt_enabled.event_name && mycb) {                                   \
        *callback = mycb;                                                      \
        return ompt_get_callback_success;                                      \
      }                                                                        \
    }                                                                          \
    return ompt_get_callback_failure;

    FOREACH_OMPT_EVENT(ompt_event_macro)

#undef ompt_event_macro

  default:
    return ompt_get_callback_failure;
  }
}